

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O2

int wally_ec_sig_to_der(uchar *sig,size_t sig_len,uchar *bytes_out,size_t len,size_t *written)

{
  bool bVar1;
  secp256k1_context *ctx;
  int iVar2;
  bool bVar3;
  size_t len_in_out;
  secp256k1_ecdsa_signature sig_secp;
  
  ctx = secp256k1_context_no_precomp;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (ctx == (secp256k1_context *)0x0) {
    iVar2 = -3;
  }
  else {
    bVar1 = false;
    len_in_out = len;
    bVar3 = false;
    if ((((written != (size_t *)0x0) && (bVar3 = bVar1, bytes_out != (uchar *)0x0)) &&
        (sig != (uchar *)0x0)) && ((sig_len == 0x40 && (0x47 < len)))) {
      iVar2 = secp256k1_ecdsa_signature_parse_compact(ctx,&sig_secp,sig);
      if (iVar2 == 0) {
        bVar3 = false;
      }
      else {
        iVar2 = secp256k1_ecdsa_signature_serialize_der(ctx,bytes_out,&len_in_out,&sig_secp);
        bVar3 = iVar2 != 0;
      }
    }
    if (bytes_out != (uchar *)0x0 && !bVar3) {
      wally_clear(bytes_out,len);
    }
    if (bVar3) {
      *written = len_in_out;
      iVar2 = 0;
    }
    else {
      iVar2 = -2;
    }
    wally_clear(&sig_secp,0x40);
  }
  return iVar2;
}

Assistant:

int wally_ec_sig_to_der(const unsigned char *sig, size_t sig_len,
                        unsigned char *bytes_out, size_t len, size_t *written)
{
    secp256k1_ecdsa_signature sig_secp;
    size_t len_in_out = len;
    const secp256k1_context *ctx = secp256k1_context_no_precomp;
    bool ok;

    if (written)
        *written = 0;

    if (!ctx)
        return WALLY_ENOMEM;

    ok = sig && sig_len == EC_SIGNATURE_LEN &&
         bytes_out && len >= EC_SIGNATURE_DER_MAX_LEN && written &&
         secp256k1_ecdsa_signature_parse_compact(ctx, &sig_secp, sig) &&
         secp256k1_ecdsa_signature_serialize_der(ctx, bytes_out,
                                                 &len_in_out, &sig_secp);

    if (!ok && bytes_out)
        wally_clear(bytes_out, len);
    if (ok)
        *written = len_in_out;
    wally_clear(&sig_secp, sizeof(sig_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}